

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.h
# Opt level: O1

void StringFormatter<unsigned_long&,unsigned_long,unsigned_long&,unsigned_long,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_long&,unsigned_char&,unsigned_short&,unsigned_int&,unsigned_long&>
     ::format<unsigned_int,unsigned_long&>(ostream *os,char *fmt,uint *value,unsigned_long *args)

{
  ostream *poVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  long lVar5;
  uint *value_00;
  ostream oVar6;
  long lVar7;
  void *pvVar8;
  runtime_error *this;
  uint uVar9;
  char *pcVar10;
  bool bVar11;
  ostream oVar12;
  char *pcVar13;
  char *__nptr;
  char *q;
  char local_6a;
  char local_69;
  undefined8 local_68;
  long local_60;
  char *local_58;
  uint *local_50;
  long local_48;
  unsigned_long *local_40;
  char *local_38;
  
  local_50 = value;
  while( true ) {
    for (; cVar2 = *fmt, cVar2 != '%'; fmt = fmt + 1) {
      if (cVar2 == '\0') {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"too many arguments for format");
        __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_69 = cVar2;
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_69,1);
    }
    cVar2 = fmt[1];
    if (cVar2 != '%') break;
    fmt = fmt + 2;
    local_6a = cVar2;
    std::__ostream_insert<char,std::char_traits<char>>(os,&local_6a,1);
  }
  pcVar10 = fmt + (cVar2 == '-');
  cVar3 = fmt[(ulong)(cVar2 == '-') + 1];
  bVar11 = cVar3 == ' ' || cVar3 == '+';
  __nptr = pcVar10 + (ulong)bVar11 + 1;
  if (*__nptr == ',') {
    __nptr = pcVar10 + (ulong)bVar11 + 2;
    oVar12 = (ostream)0x2c;
  }
  else {
    oVar12 = (ostream)0x20;
    if (*__nptr == '0') {
      __nptr = pcVar10 + (ulong)bVar11 + 2;
      oVar12 = (ostream)0x30;
    }
  }
  local_40 = args;
  local_48 = strtol(__nptr,&local_38,10);
  local_58 = local_38;
  if (*local_38 == '.') {
    pcVar13 = local_38 + 1;
    lVar7 = strtol(pcVar13,&local_38,10);
    local_68 = CONCAT71((int7)((ulong)pcVar10 >> 8),pcVar13 != local_38);
    local_60 = (long)(int)lVar7;
  }
  else {
    local_60 = 0;
    local_68 = 0;
  }
  do {
    pcVar10 = local_38;
    cVar4 = *pcVar10;
    pvVar8 = memchr("qhlLzjt",(int)cVar4,8);
    local_38 = pcVar10 + 1;
  } while (pvVar8 != (void *)0x0);
  pcVar13 = pcVar10;
  if ((cVar4 == 'I') && (pcVar13 = pcVar10 + 1, (byte)(pcVar10[2] | 2U) == 0x36)) {
    pcVar13 = pcVar10 + 3;
  }
  cVar4 = *pcVar13;
  StringFormatter<unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
  ::applytype(os,cVar4);
  value_00 = local_50;
  lVar7 = *(long *)(*(long *)os + -0x18);
  if (cVar3 == '+') {
    uVar9 = *(uint *)(os + lVar7 + 0x18) | 0x800;
  }
  else {
    uVar9 = *(uint *)(os + lVar7 + 0x18) & 0xfffff7ff;
  }
  *(uint *)(os + lVar7 + 0x18) = uVar9;
  if (cVar2 == '-' || cVar3 == '+') {
    *(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) =
         (uint)(cVar2 == '-') * 0x10 +
         (*(uint *)(os + *(long *)(*(long *)os + -0x18) + 0x18) & 0xffffff4f) + 0x10;
  }
  lVar7 = *(long *)os;
  lVar5 = *(long *)(lVar7 + -0x18);
  if (__nptr == local_58) {
    *(undefined8 *)(os + lVar5 + 0x10) = 0;
  }
  else {
    *(long *)(os + lVar5 + 0x10) = (long)(int)local_48;
    if (cVar2 != '-' && cVar3 != '+') {
      lVar7 = *(long *)(lVar7 + -0x18);
      *(uint *)(os + lVar7 + 0x18) = *(uint *)(os + lVar7 + 0x18) & 0xffffff4f | 0x80;
    }
  }
  if ((char)local_68 != '\0') {
    *(long *)(os + *(long *)(*(long *)os + -0x18) + 8) = local_60;
  }
  poVar1 = os + *(long *)(*(long *)os + -0x18);
  if (os[*(long *)(*(long *)os + -0x18) + 0xe1] == (ostream)0x0) {
    oVar6 = (ostream)std::ios::widen((char)poVar1);
    poVar1[0xe0] = oVar6;
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = oVar12;
  if ((cVar4 != 'c') ||
     (bVar11 = StringFormatter<unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
               ::output_wchar<unsigned_int>(os,value_00), !bVar11)) {
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 8) = 0;
  StringFormatter<unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_long_&,_unsigned_char_&,_unsigned_short_&,_unsigned_int_&,_unsigned_long_&>
  ::format<unsigned_long>(os,pcVar13 + (cVar4 != '\0'),local_40);
  return;
}

Assistant:

static void format(std::ostream& os, const char *fmt, T& value, FARGS&&...args) 
    {
        bool used_value = false;
        const char *p= fmt;
        while (*p) {
            if (*p=='%') {
                p++;
                if (*p=='%') {
                    os << *p++;
                }
                else {

                    // '-'  means left adjust
                    bool leftadjust= false;
                    if (*p=='-') {
                        p++;
                        leftadjust= true;
                    }
                    bool forcesign= false;
                    //bool blankforpositive= false;
                    if (*p=='+') {
                        p++;
                        forcesign= true;
                    }
                    else if (*p==' ') {
                        p++;
                        //blankforpositive= true;  // <-- todo
                    }
                    
                    // '0' means pad with zero
                    // ',' is useful for arrays
                    char padchar= ' ';

                    if (*p=='0') { p++; padchar='0'; }
                    else if (*p==',') { p++; padchar=','; }

                    // width specification
                    char *q;
                    // todo: support '*'  : take size from argumentlist.
                    // todo: support '#'  : adds 0, 0x, 0X prefix to oct/hex numbers -> 'showbase'
                    int width= strtol(p, &q, 10);
                    bool havewidth= p!=q;
                    p= q;

                    // precision after '.'
                    int precision= 0;
                    bool haveprecision= false;
                    if (*p=='.') {
                        p++;
                        // todo: support '*'
                        precision= strtol(p, &q, 10);
                        haveprecision= p!=q;
                        p= q;
                    }

                    // ignore argument size field
                    while (std::strchr("qhlLzjt", *p))
                        p++;
                    if (*p=='I') {
                        // microsoft I64 specifier
                        p++;
                        if (p[1]=='6' || p[1]=='4') {
                            p+=2;
                        }
                    }

                    char type= 0;
                    if (*p)
                        type= *p++;

                    // use formatting
                    applytype(os, type);
                    if (forcesign)
                        os << std::showpos;
                    else
                        os << std::noshowpos;

                    if (leftadjust)
                        os << std::left;
                    else if (forcesign) {
                        // exception: when forcing display of sign
                        // we need to use 'internal fill'
                        os << std::internal;
                    }

                    if (havewidth) {
                        os.width(width);
                        if (!leftadjust && !forcesign)
                            os << std::right;
                    }
                    else {
                        os.width(0);
                    }
                    // todo: support precision(truncate) for strings
                    if (haveprecision)
                        os.precision(precision);
                    os.fill(padchar);

                    if (type=='c' && output_wchar(os, value))
                    {
                        // nop
                    }
                    else if (type=='p' && output_pointer(os, value))
                    {
                        // nop
                    }
                    else if (type=='b' && output_hex_data(os, value))
                    {
                        // nop
                    }
                    else if (std::strchr("iduoxX", type) && output_int(os, value))
                    {
                        // nop
                    }
                    else if (type=='s' && output_null(os, value))
                    {
                        // nop
                    }
                    else if (output_using_operator(os, value))
                    {
                        // when type ~ float/double : '[AEFGaefg]' || type == 's' || other outputs failed.
                        // nop
                    }
                    else {
                        os << "<?>";
                    }

                    // TODO: improve float formatting

                    // reset precision
                    os.precision(0);

                    used_value = true;

                    format(os, p, args...);
                    return;
                }
            }
            else {
                os << *p++;
            }
        }

        if (!used_value)
            throw std::runtime_error("too many arguments for format");
    }